

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTxOut::ConfidentialTxOut
          (ConfidentialTxOut *this,Address *address,ConfidentialAssetId *asset,Amount *amount)

{
  Script *in_stack_ffffffffffffff60;
  Script local_60;
  Amount *local_28;
  Amount *amount_local;
  ConfidentialAssetId *asset_local;
  Address *address_local;
  ConfidentialTxOut *this_local;
  
  local_28 = amount;
  amount_local = (Amount *)asset;
  asset_local = (ConfidentialAssetId *)address;
  address_local = (Address *)this;
  core::Address::GetLockingScript(&local_60,address);
  AbstractTxOut::AbstractTxOut(&this->super_AbstractTxOut,&local_60);
  Script::~Script(in_stack_ffffffffffffff60);
  (this->super_AbstractTxOut)._vptr_AbstractTxOut = (_func_int **)&PTR__ConfidentialTxOut_009f73a0;
  ConfidentialAssetId::ConfidentialAssetId(&this->asset_,(ConfidentialAssetId *)amount_local);
  ConfidentialValue::ConfidentialValue(&this->confidential_value_,local_28);
  ConfidentialNonce::ConfidentialNonce(&this->nonce_);
  ByteData::ByteData(&this->surjection_proof_);
  ByteData::ByteData(&this->range_proof_);
  return;
}

Assistant:

ConfidentialTxOut::ConfidentialTxOut(
    const Address &address, const ConfidentialAssetId &asset,
    const Amount &amount)
    : AbstractTxOut(address.GetLockingScript()),
      asset_(asset),
      confidential_value_(ConfidentialValue(amount)),
      nonce_(),
      surjection_proof_(),
      range_proof_() {
  // do nothing
}